

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3AnalysisLoad(sqlite3 *db,int iDb)

{
  uint *puVar1;
  Schema *pSVar2;
  Index *pIdx;
  void *pvVar3;
  int iVar4;
  HashElem *pHVar5;
  Table *pTVar6;
  char *pcVar7;
  analysisInfo sInfo;
  sqlite3 *local_40;
  char *local_38;
  
  pSVar2 = db->aDb[iDb].pSchema;
  for (pHVar5 = (pSVar2->tblHash).first; pHVar5 != (HashElem *)0x0; pHVar5 = pHVar5->next) {
    puVar1 = (uint *)((long)pHVar5->data + 0x40);
    *puVar1 = *puVar1 & 0xffffffef;
  }
  for (pHVar5 = (pSVar2->idxHash).first; pHVar5 != (HashElem *)0x0; pHVar5 = pHVar5->next) {
    pIdx = (Index *)pHVar5->data;
    *(ushort *)&pIdx->field_0x63 = *(ushort *)&pIdx->field_0x63 & 0xff7f;
    sqlite3DeleteIndexSamples(db,pIdx);
    pIdx->aSample = (IndexSample *)0x0;
  }
  local_38 = db->aDb[iDb].zDbSName;
  local_40 = db;
  pTVar6 = sqlite3FindTable(db,"sqlite_stat1",local_38);
  if (pTVar6 == (Table *)0x0) {
    iVar4 = 0;
  }
  else {
    pcVar7 = sqlite3MPrintf(db,"SELECT tbl,idx,stat FROM %Q.sqlite_stat1",local_38);
    if (pcVar7 == (char *)0x0) {
      iVar4 = 7;
    }
    else {
      iVar4 = sqlite3_exec(db,pcVar7,analysisLoader,&local_40,(char **)0x0);
      sqlite3DbFreeNN(db,pcVar7);
    }
  }
  for (pHVar5 = (pSVar2->idxHash).first; pcVar7 = local_38, pHVar5 != (HashElem *)0x0;
      pHVar5 = pHVar5->next) {
    if ((((Index *)pHVar5->data)->field_0x63 & 0x80) == 0) {
      sqlite3DefaultRowEst((Index *)pHVar5->data);
    }
  }
  if (iVar4 == 0) {
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    pTVar6 = sqlite3FindTable(db,"sqlite_stat4",local_38);
    if (pTVar6 == (Table *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = loadStatTbl(db,0,"SELECT idx,count(*) FROM %Q.sqlite_stat4 GROUP BY idx",
                          "SELECT idx,neq,nlt,ndlt,sample FROM %Q.sqlite_stat4",pcVar7);
    }
    if (iVar4 == 0) {
      pTVar6 = sqlite3FindTable(db,"sqlite_stat3",pcVar7);
      if (pTVar6 == (Table *)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = loadStatTbl(db,1,"SELECT idx,count(*) FROM %Q.sqlite_stat3 GROUP BY idx",
                            "SELECT idx,neq,nlt,ndlt,sqlite_record(sample) FROM %Q.sqlite_stat3",
                            pcVar7);
      }
    }
    (db->lookaside).bDisable = (db->lookaside).bDisable - 1;
  }
  for (pHVar5 = (pSVar2->idxHash).first; pHVar5 != (HashElem *)0x0; pHVar5 = pHVar5->next) {
    pvVar3 = pHVar5->data;
    sqlite3_free(*(void **)((long)pvVar3 + 0x80));
    *(undefined8 *)((long)pvVar3 + 0x80) = 0;
  }
  if (iVar4 == 7) {
    sqlite3OomFault(db);
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3AnalysisLoad(sqlite3 *db, int iDb){
  analysisInfo sInfo;
  HashElem *i;
  char *zSql;
  int rc = SQLITE_OK;
  Schema *pSchema = db->aDb[iDb].pSchema;

  assert( iDb>=0 && iDb<db->nDb );
  assert( db->aDb[iDb].pBt!=0 );

  /* Clear any prior statistics */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&pSchema->tblHash); i; i=sqliteHashNext(i)){
    Table *pTab = sqliteHashData(i);
    pTab->tabFlags &= ~TF_HasStat1;
  }
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    pIdx->hasStat1 = 0;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3DeleteIndexSamples(db, pIdx);
    pIdx->aSample = 0;
#endif
  }

  /* Load new statistics out of the sqlite_stat1 table */
  sInfo.db = db;
  sInfo.zDatabase = db->aDb[iDb].zDbSName;
  if( sqlite3FindTable(db, "sqlite_stat1", sInfo.zDatabase)!=0 ){
    zSql = sqlite3MPrintf(db, 
        "SELECT tbl,idx,stat FROM %Q.sqlite_stat1", sInfo.zDatabase);
    if( zSql==0 ){
      rc = SQLITE_NOMEM_BKPT;
    }else{
      rc = sqlite3_exec(db, zSql, analysisLoader, &sInfo, 0);
      sqlite3DbFree(db, zSql);
    }
  }

  /* Set appropriate defaults on all indexes not in the sqlite_stat1 table */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    if( !pIdx->hasStat1 ) sqlite3DefaultRowEst(pIdx);
  }

  /* Load the statistics from the sqlite_stat4 table. */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( rc==SQLITE_OK ){
    db->lookaside.bDisable++;
    rc = loadStat4(db, sInfo.zDatabase);
    db->lookaside.bDisable--;
  }
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    sqlite3_free(pIdx->aiRowEst);
    pIdx->aiRowEst = 0;
  }
#endif

  if( rc==SQLITE_NOMEM ){
    sqlite3OomFault(db);
  }
  return rc;
}